

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O3

void process_world(chunk *c)

{
  uint32_t *puVar1;
  wchar_t *pwVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  curse_data *pcVar6;
  level_conflict *plVar7;
  undefined8 uVar8;
  player_body body;
  curse *pcVar9;
  chunk *c_00;
  _Bool _Var10;
  _Bool _Var11;
  int16_t iVar12;
  short sVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  uint32_t uVar16;
  monster *pmVar17;
  undefined8 extraout_RAX;
  int16_t *piVar18;
  monster_conflict *mon;
  angband_constants *paVar19;
  player_upkeep *ppVar20;
  loc lVar21;
  square *psVar22;
  trap *ptVar23;
  bool bVar24;
  short sVar25;
  uint8_t uVar26;
  int iVar27;
  uint32_t m;
  uint uVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  char *fmt;
  player *ppVar31;
  bitflag *flags;
  long lVar32;
  ulong uVar33;
  object *poVar34;
  ulong uVar35;
  source sVar36;
  source origin;
  source origin_00;
  _Bool ident;
  uint local_40;
  int local_3c;
  chunk *local_38;
  
  wVar14 = cave_monster_count((chunk_conflict *)c);
  if ((int)(uint)z_info->level_monster_max < wVar14 + L' ') {
    compact_monsters(c,L'@');
  }
  wVar14 = cave_monster_count((chunk_conflict *)c);
  wVar15 = cave_monster_max((chunk_conflict *)c);
  if (wVar14 + L' ' < wVar15) {
    compact_monsters(c,L'\0');
  }
  if (turn % (int)((uint)z_info->day_length * 10 >> 2) == 0) {
    play_ambient_sound();
  }
  if ((0xfffffffd < world->levels[player->place].topography - TOP_MOUNTAINTOP) ||
     (uVar4 = z_info->day_length, turn % (int)((uint)uVar4 + (uint)uVar4 * 4) != 0))
  goto LAB_00145ae9;
  iVar27 = turn % (int)((uint)uVar4 * 10);
  if (iVar27 == 0) {
    msg("The sun has risen.");
    wVar14 = cave_monster_max(cave);
    if (wVar14 < L'\x03') {
      process_monsters(L'\0');
    }
    else {
      wVar14 = L'\x01';
      local_40 = 0;
      local_3c = iVar27;
      do {
        pmVar17 = cave_monster(cave,wVar14);
        if (pmVar17->race != (monster_race *)0x0) {
          flags = pmVar17->race->flags;
          _Var10 = flag_has_dbg(flags,0xc,1,"race->flags","RF_UNIQUE");
          if ((!_Var10) &&
             (_Var10 = flag_has_dbg(flags,0xc,0x4c,"race->flags","RF_HURT_LIGHT"), _Var10)) {
            delete_monster_idx((chunk *)cave,wVar14);
            local_40 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
        }
        wVar14 = wVar14 + L'\x01';
        wVar15 = cave_monster_max(cave);
      } while (wVar14 < wVar15 + L'\xffffffff');
      process_monsters(L'\0');
      iVar27 = local_3c;
      if ((local_40 & 1) != 0) {
        fmt = "Creatures of the darkness flee from the sunlight!";
        goto LAB_001459d7;
      }
    }
  }
  else {
    fmt = "The sun has fallen.";
LAB_001459d7:
    msg(fmt);
  }
  cave_illuminate(c,iVar27 == 0);
LAB_00145ae9:
  if ((player->depth != 0) && (turn % (int)((uint)z_info->store_turns * 10) == 0)) {
    daycount = daycount + 1;
  }
  _Var10 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
  if (_Var10) {
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  wVar14 = c->ghost->bones_selector;
  uVar16 = Rand_div((uint)z_info->alloc_monster_chance);
  if ((uVar16 == 0) && (player->themed_level == '\0')) {
    lVar21.x = (player->grid).x;
    lVar21.y = (player->grid).y;
    pick_and_place_distant_monster
              (c,lVar21,(uint)z_info->max_sight + L'\x05',true,(int)player->depth);
  }
  if ((c->ghost->bones_selector != L'\0') && (wVar14 == L'\0')) {
    if (c->ghost->race == L'\0') {
      __assert_fail("c->ghost && c->ghost->race",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                    ,0x28c,"void process_world(struct chunk *)");
    }
    ghost_challenge();
  }
  ppVar31 = player;
  piVar18 = player->timed;
  if (piVar18[7] != 0) {
    wVar14 = player_apply_damage_reduction(player,L'\x01');
    take_hit(ppVar31,wVar14,"poison");
    if (player->is_dead != false) {
      return;
    }
    piVar18 = player->timed;
  }
  if (piVar18[8] != 0) {
    _Var10 = flag_has_dbg((player->state).pflags,10,1,"player->state.pflags","(PF_ROCK)");
    wVar14 = L'\0';
    if (!_Var10) {
      _Var10 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
      wVar14 = L'\x03';
      if ((!_Var10) && (_Var10 = player_timed_grade_eq(player,L'\b',"Deep Gash"), !_Var10)) {
        _Var10 = player_timed_grade_eq(player,L'\b',"Severe Cut");
        wVar14 = (uint)_Var10 + L'\x01';
      }
    }
    ppVar31 = player;
    wVar14 = player_apply_damage_reduction(player,wVar14);
    take_hit(ppVar31,wVar14,"a fatal wound");
    if (player->is_dead != false) {
      return;
    }
    piVar18 = player->timed;
  }
  sVar13 = piVar18[0x31];
  if (sVar13 != 0) {
    wVar14 = L'\0';
    if (sVar13 < 10) {
      wVar14 = L'\n' - sVar13;
    }
    player_over_exert(player,L'È',wVar14,(int)player->chp / 10);
    if (player->is_dead != false) {
      return;
    }
    piVar18 = player->timed;
  }
  if (piVar18[0x2b] != 0) {
    ident = false;
    sVar36 = source_player();
    origin.which = sVar36.which;
    origin._4_4_ = 0;
    origin.what = sVar36.what;
    effect_simple(L'\x03',origin,"30",L'\0',L'\0',L'\0',L'\0',L'\0',&ident);
    piVar18 = player->timed;
  }
  if (piVar18[0x32] != 0) {
    _Var10 = flag_has_dbg((player->state).pflags,10,0x10,"player->state.pflags","(PF_HARDY)");
    m = (uint)_Var10 * 2 + 2;
    uVar16 = Rand_div(m);
    if (uVar16 == 0) {
      msg("The Black Breath sickens you.");
      player_stat_dec(player,L'\x04',false);
    }
    uVar16 = Rand_div(m);
    if (uVar16 == 0) {
      msg("The Black Breath saps your strength.");
      player_stat_dec(player,L'\0',false);
    }
    uVar16 = Rand_div(m);
    if (uVar16 == 0) {
      iVar27 = player->exp;
      uVar4 = z_info->life_drain_percent;
      msg("The Black Breath dims your life force.");
      player_exp_lose(player,(uint)uVar4 * (iVar27 / 100) + 100,false);
    }
  }
  _Var10 = player_timed_grade_eq(player,L'\n',"Full");
  if (_Var10) {
    player_dec_timed(player,L'\n',5000 / z_info->food_value,false,true);
    ppVar31 = player;
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  else {
    if ((turn * -0x3d70a3d7 + 0x51eb850U >> 2 | turn * 0x40000000) < 0x28f5c29) {
      bVar3 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [(player->state).speed];
      uVar4 = z_info->move_energy;
      uVar5 = z_info->food_value;
      _Var10 = player_of_has(player,L'\f');
      _Var11 = player_of_has(player,L'\n');
      uVar28 = (((((uint)uVar4 * (uint)bVar3) / 100) * 100) / (uint)uVar5 << _Var10) >> _Var11;
      player_dec_timed(player,L'\n',uVar28 + (uVar28 == 0),false,true);
    }
    ppVar31 = player;
    if ((player->timed[0x2b] != 0) &&
       (player_dec_timed(player,L'\n',(uint)z_info->food_value << 3,false,true), ppVar31 = player,
       player->timed[10] < PY_FOOD_HUNGRY)) {
      player_set_timed(player,L'+',L'\0',true,true);
      ppVar31 = player;
    }
  }
  _Var10 = player_timed_grade_eq(ppVar31,L'\n',"Faint");
  if (_Var10) {
    if ((player->timed[3] == 0) && (uVar16 = Rand_div(10), uVar16 == 0)) {
      msg("You faint from the lack of food.");
      disturb(player);
      ppVar31 = player;
      uVar16 = Rand_div(5);
      player_inc_timed(ppVar31,L'\x03',uVar16 + L'\x01',true,true,false);
    }
  }
  else {
    _Var10 = player_timed_grade_eq(player,L'\n',"Starving");
    ppVar31 = player;
    if (_Var10) {
      wVar14 = player_apply_damage_reduction(player,(PY_FOOD_STARVE - player->timed[10]) / 10);
      take_hit(ppVar31,wVar14,"starvation");
      if (player->is_dead != false) {
        return;
      }
    }
  }
  local_38 = c;
  if (player->chp < player->mhp) {
    player_regen_hp(player);
  }
  player_regen_mana(player);
  wVar14 = adj_con_fix[(player->state).stat_ind[4]] + L'\x01';
  lVar32 = 0;
  do {
    if (player->timed[lVar32] != 0) {
      wVar15 = (wchar_t)lVar32;
      wVar30 = wVar14;
      wVar29 = wVar14;
      switch(wVar15) {
      case L'\a':
        _Var10 = flag_has_dbg((player->state).pflags,10,0x10,"player->state.pflags","(PF_HARDY)");
        wVar30 = (uint)_Var10 + wVar14;
        break;
      case L'\b':
        _Var10 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
        wVar29 = L'\0';
        if (!_Var10) {
          _Var10 = flag_has_dbg((player->state).pflags,10,0x10,"player->state.pflags","(PF_HARDY)");
          wVar30 = (uint)_Var10 + wVar14;
          wVar29 = wVar14;
        }
        _Var10 = flag_has_dbg((player->state).pflags,10,1,"player->state.pflags","(PF_ROCK)");
        if (_Var10) {
          wVar29 = L'\0';
        }
        break;
      case L'\t':
        break;
      case L'\n':
        wVar29 = L'\0';
        break;
      default:
        wVar29 = L'\x01';
        if (wVar15 == L',') {
          mon = get_commanded_monster();
          _Var10 = los(cave,player->grid,(loc_conflict)mon->grid);
          wVar29 = L'\x01';
          if (_Var10) {
            mon_dec_timed((monster *)mon,L'\b',L'\x01',L'\0');
          }
          else {
            mon_clear_timed((monster *)mon,L'\b',L'\x01');
            player_clear_timed(player,L',',true,true);
          }
        }
      }
      _Var10 = flag_has_dbg((player->state).pflags,10,0x42,"player->state.pflags",
                            "(PF_ENHANCE_MAGIC)");
      wVar14 = wVar30;
      if (((!_Var10) || (0x55555554 < turn * -0x55555555 + 0x2aaaaaaaU)) ||
         (_Var10 = player_timed_effect_is_beneficial(wVar15), !_Var10)) {
        player_dec_timed(player,wVar15,wVar29,false,true);
      }
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x35);
  ppVar31 = player;
  if ((player->body).count != 0) {
    uVar35 = 0;
    do {
      poVar34 = (ppVar31->body).slots[uVar35].obj;
      if (((poVar34 != (object *)0x0) && (pcVar6 = poVar34->curses, pcVar6 != (curse_data *)0x0)) &&
         (z_info->curse_max != '\0')) {
        lVar32 = 0;
        uVar33 = 0;
        paVar19 = z_info;
        do {
          if (pcVar6[uVar33].power != L'\0') {
            pwVar2 = &pcVar6[uVar33].timeout;
            *pwVar2 = *pwVar2 + L'\xffffffff';
            pcVar9 = curses;
            if (*pwVar2 == L'\0') {
              _Var10 = do_curse_effect((wchar_t)uVar33,(player->body).slots[uVar35].obj);
              if (_Var10) {
                player_learn_curse(player,(curse *)(pcVar9->conflict_flags + lVar32 + -0x28));
              }
              wVar14 = randcalc(*(random_value *)
                                 (*(long *)(pcVar9->conflict_flags + lVar32 + -0x10) + 0x118),0,
                                RANDOMISE);
              pcVar6[uVar33].timeout = wVar14;
              paVar19 = z_info;
            }
          }
          uVar33 = uVar33 + 1;
          lVar32 = lVar32 + 0x38;
          ppVar31 = player;
        } while (uVar33 < paVar19->curse_max);
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 < (ppVar31->body).count);
  }
  c_00 = local_38;
  sVar13 = ppVar31->heighten_power;
  if (sVar13 != 0) {
    sVar25 = (short)((uint)(sVar13 * 0x6b0d) >> 0x10) - sVar13;
    iVar27 = (int)(short)(((sVar25 >> 5) - (sVar25 >> 0xf)) + -10) + (int)sVar13;
    iVar12 = 0;
    if (0 < iVar27) {
      iVar12 = (int16_t)iVar27;
    }
    ppVar31->heighten_power = iVar12;
    puVar1 = &ppVar31->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  sVar13 = ppVar31->speed_boost;
  if (sVar13 != 0) {
    sVar25 = 0;
    if (9 < sVar13) {
      sVar25 = sVar13 + -10;
    }
    ppVar31->speed_boost = sVar25;
    puVar1 = &ppVar31->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  player_update_light(ppVar31);
  _Var10 = player_is_resting(player);
  if (!_Var10) {
    make_noise(cave,player,(monster *)0x0);
    update_scent(cave,player,(monster *)0x0);
  }
  _Var10 = player_of_has(player,L'\x1f');
  if (_Var10) {
    if ((0 < player->exp) && (uVar16 = Rand_div(10), uVar16 == 0)) {
      iVar27 = damroll(10,6);
      player_exp_lose(player,(int)((uint)z_info->life_drain_percent * (player->exp / 100) + iVar27)
                             / 10,false);
    }
    equip_learn_flag(player,L'\x1f');
  }
  poVar34 = player->gear;
  do {
    if (poVar34 == (object *)0x0) {
      if (1 < cave->obj_max) {
        uVar35 = 1;
        do {
          poVar34 = cave->objects[uVar35];
          if ((poVar34 != (object *)0x0) && (_Var10 = tval_can_have_timeout(poVar34), _Var10)) {
            recharge_timeout(poVar34);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < cave->obj_max);
      }
      if ((turn * -0x3d70a3d7 + 0x51eb850U >> 2 | turn * 0x40000000) < 0x28f5c29) {
        equip_learn_after_time(player);
      }
      wVar14 = c_00->height;
      if (L'\0' < wVar14) {
        wVar15 = c_00->width;
        wVar30 = L'\0';
        do {
          if (L'\0' < wVar15) {
            wVar14 = L'\0';
            do {
              lVar21 = (loc)loc(wVar14,wVar30);
              psVar22 = square((chunk_conflict *)c_00,lVar21);
              ptVar23 = psVar22->trap;
              if (ptVar23 != (trap *)0x0) {
                bVar24 = false;
                do {
                  if (ptVar23->timeout != '\0') {
                    uVar26 = ptVar23->timeout + 0xff;
                    ptVar23->timeout = uVar26;
                    bVar24 = (bool)(bVar24 | uVar26 == '\0');
                  }
                  ptVar23 = ptVar23->next;
                } while (ptVar23 != (trap *)0x0);
                if ((bVar24) && (_Var10 = square_isseen((chunk_conflict *)c_00,lVar21), _Var10)) {
                  square_memorize_traps(c_00,lVar21);
                  square_light_spot(c_00,lVar21);
                }
              }
              wVar14 = wVar14 + L'\x01';
              wVar15 = c_00->width;
            } while (wVar14 < wVar15);
            wVar14 = c_00->height;
          }
          wVar30 = wVar30 + L'\x01';
        } while (wVar30 < wVar14);
      }
      ppVar31 = player;
      if (((player->word_recall != 0) && (player->upkeep->arena_level == false)) &&
         (sVar13 = player->word_recall + -1, player->word_recall = sVar13, sVar13 == 0)) {
        disturb(ppVar31);
        cmdq_flush();
        if (player->place == player->home) {
          msgt(0x19,"You feel yourself yanked away!");
          player_change_place(player,(int)player->recall_pt);
          ppVar31 = player;
        }
        else {
          if (player->upkeep->arena_level == true) {
            iVar12 = player->last_place;
          }
          else {
            iVar12 = 0;
          }
          msgt(0x19,"You feel yourself yanked homewards!");
          player_change_place(player,(int)player->home);
          ppVar31 = player;
          player->last_place = iVar12;
        }
      }
      if ((ppVar31->deep_descent != 0) &&
         (sVar13 = ppVar31->deep_descent + -1, ppVar31->deep_descent = sVar13, sVar13 == 0)) {
        wVar14 = player_get_next_place((int)ppVar31->place,"down",L'\x05');
        plVar7 = world->levels;
        disturb(player);
        if ((int)player->depth < plVar7[wVar14].depth) {
          msgt(0x19,"The floor opens beneath you!");
          player_change_place(player,wVar14);
        }
        else {
          msgt(0x19,"You are thrown back in an explosion!");
          sVar36 = source_none();
          origin_00.which = sVar36.which;
          origin_00._4_4_ = 0;
          origin_00.what = sVar36.what;
          effect_simple(L'@',origin_00,"0",L'\0',L'\x05',L'\0',L'\0',L'\0',(_Bool *)0x0);
        }
      }
      return;
    }
    if (poVar34->kind == (object_kind *)0x0) {
      __assert_fail("obj->kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                    ,0x155,"void recharge_objects(void)");
    }
    uVar8 = *(undefined8 *)&(player->body).count;
    body.name._4_4_ = (int)((ulong)(player->body).name >> 0x20);
    body._0_12_ = *(undefined1 (*) [12])&player->body;
    body._16_4_ = (int)uVar8;
    body._20_4_ = (int)((ulong)uVar8 >> 0x20);
    body.slots = (player->body).slots;
    _Var10 = object_is_equipped(body,poVar34);
    if (_Var10) {
      _Var10 = recharge_timeout(poVar34);
      if (_Var10) {
        recharged_notice(poVar34,true);
        ppVar20 = player->upkeep;
        uVar28 = 0x40000;
LAB_001465c0:
        ppVar20->redraw = ppVar20->redraw | uVar28;
      }
    }
    else {
      wVar14 = number_charging(poVar34);
      bVar3 = poVar34->number;
      _Var10 = tval_can_have_timeout(poVar34);
      if ((_Var10) && (_Var10 = recharge_timeout(poVar34), _Var10)) {
        if ((poVar34->timeout == 0) || (wVar14 == (uint)bVar3)) {
          recharged_notice(poVar34,poVar34->timeout == 0);
        }
        ppVar20 = player->upkeep;
        ppVar20->notice = ppVar20->notice | 1;
        uVar28 = 0x20000;
        goto LAB_001465c0;
      }
    }
    poVar34 = poVar34->next;
  } while( true );
}

Assistant:

void process_world(struct chunk *c)
{
	int i, y, x;
	bool was_ghost = false;

	/* Compact the monster list if we're approaching the limit */
	if (cave_monster_count(c) + 32 > z_info->level_monster_max)
		compact_monsters(c, 64);

	/* Too many holes in the monster list - compress */
	if (cave_monster_count(c) + 32 < cave_monster_max(c))
		compact_monsters(c, 0);

	/*** Check the Time ***/

	/* Play an ambient sound at regular intervals. */
	if (!(turn % ((10L * z_info->day_length) / 4)))
		play_ambient_sound();

	/* Handle stores and sunshine */
	if (outside()) {
		/* Daybreak/Nightfall in town */
		if (!(turn % ((10L * z_info->day_length) / 2))) {
			/* Check for dawn */
			bool dawn = (!(turn % (10L * z_info->day_length)));

			if (dawn) {
				/* Day breaks */
				msg("The sun has risen.");
				sun_banish();
			} else {
				/* Night falls */
				msg("The sun has fallen.");
			}

			/* Illuminate */
			cave_illuminate(c, dawn);
		}
	}

	/* Update the stores once a day.  The changes are not actually made until
	 * return to town, to avoid giving details away in the knowledge menu. */
	if (player->depth && !(turn % (10L * z_info->store_turns))) daycount++;

	/* Check for light change */
	if (player_has(player, PF_UNLIGHT)) {
		player->upkeep->update |= PU_BONUS;
	}

	/* See if there is already a player ghost on the level */
	if (c->ghost->bones_selector) {
		was_ghost = true;
	}

	/* Check for creature generation */
	if (one_in_(z_info->alloc_monster_chance) && (!player->themed_level)) {
		(void)pick_and_place_distant_monster(c, player->grid,
			z_info->max_sight + 5, true, player->depth);
	}

	/* If there is ghost now, and there was not before, give a challenge */
	if (c->ghost->bones_selector && !was_ghost) {
		assert(c->ghost && c->ghost->race);
		ghost_challenge();
	}

	/*** Damage (or healing) over Time ***/

	/* Take damage from poison */
	if (player->timed[TMD_POISONED]) {
		take_hit(player, player_apply_damage_reduction(player, 1),
			"poison");
		if (player->is_dead) {
			return;
		}
	}

	/* Take damage from cuts, worse from serious cuts */
	if (player->timed[TMD_CUT]) {
		if (player_has(player, PF_ROCK)) {
			/* Rock players just maintain */
			i = 0;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Mortal Wound") ||
				   player_timed_grade_eq(player, TMD_CUT, "Deep Gash")) {
			i = 3;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Severe Cut")) {
			i = 2;
		} else {
			i = 1;
		}

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"a fatal wound");
		if (player->is_dead) {
			return;
		}
	}

	/* Side effects of diminishing bloodlust */
	if (player->timed[TMD_BLOODLUST]) {
		player_over_exert(player, PY_EXERT_HP | PY_EXERT_CUT | PY_EXERT_SLOW,
						  MAX(0, 10 - player->timed[TMD_BLOODLUST]),
						  player->chp / 10);
		if (player->is_dead) {
			return;
		}
	}

	/* Timed healing */
	if (player->timed[TMD_HEAL]) {
		bool ident = false;
		effect_simple(EF_HEAL_HP, source_player(), "30", 0, 0, 0, 0, 0, &ident);
	}

	/* Effects of Black Breath */
	if (player->timed[TMD_BLACKBREATH]) {
		bool hardy = player_has(player, PF_HARDY);

		if (one_in_(hardy ? 4 : 2)) {
			msg("The Black Breath sickens you.");
			player_stat_dec(player, STAT_CON, false);
		}
		if (one_in_(hardy ? 4 : 2)) {
			msg("The Black Breath saps your strength.");
			player_stat_dec(player, STAT_STR, false);
		}
		if (one_in_(hardy ? 4 : 2)) {
			/* Life draining */
			int drain = 100 + (player->exp / 100) * z_info->life_drain_percent;
			msg("The Black Breath dims your life force.");
			player_exp_lose(player, drain, false);
		}
	}

	/*** Check the Food, and Regenerate ***/

	/* Digest */
	if (!player_timed_grade_eq(player, TMD_FOOD, "Full")) {
		/* Digest normally */
		if (!(turn % 100)) {
			/* Basic digestion rate based on speed */
			i = turn_energy(player->state.speed);

			/* Adjust for food value */
			i = (i * 100) / z_info->food_value;

			/* Regeneration takes more food */
			if (player_of_has(player, OF_REGEN)) i *= 2;

			/* Slow digestion takes less food */
			if (player_of_has(player, OF_SLOW_DIGEST)) i /= 2;

			/* Minimal digestion */
			if (i < 1) i = 1;

			/* Digest some food */
			player_dec_timed(player, TMD_FOOD, i, false, true);
		}

		/* Fast metabolism */
		if (player->timed[TMD_HEAL]) {
			player_dec_timed(player, TMD_FOOD,
				8 * z_info->food_value, false, true);
			if (player->timed[TMD_FOOD] < PY_FOOD_HUNGRY) {
				player_set_timed(player, TMD_HEAL, 0, true,
					true);
			}
		}
	} else {
		/* Digest quickly when gorged */
		player_dec_timed(player, TMD_FOOD, 5000 / z_info->food_value,
			false, true);
		player->upkeep->update |= PU_BONUS;
	}

	/* Faint or starving */
	if (player_timed_grade_eq(player, TMD_FOOD, "Faint")) {
		/* Faint occasionally */
		if (!player->timed[TMD_PARALYZED] && one_in_(10)) {
			/* Message */
			msg("You faint from the lack of food.");
			disturb(player);

			/* Faint (bypass free action) */
			(void)player_inc_timed(player, TMD_PARALYZED,
				1 + randint0(5), true, true, false);
		}
	} else if (player_timed_grade_eq(player, TMD_FOOD, "Starving")) {
		/* Calculate damage */
		i = (PY_FOOD_STARVE - player->timed[TMD_FOOD]) / 10;

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"starvation");
		if (player->is_dead) {
			return;
		}
	}

	/* Regenerate Hit Points if needed */
	if (player->chp < player->mhp)
		player_regen_hp(player);

	/* Regenerate or lose mana */
	player_regen_mana(player);

	/* Timeout various things */
	decrease_timeouts();

	/* Decay special heighten power */
	if (player->heighten_power) {
		/* To keep it from being a free ride for high speed 
		 * characters, Heighten Power decays quickly when highly charged */
		int decrement = 10 + (player->heighten_power / 55);
		player->heighten_power = MAX(0, player->heighten_power - decrement);
		player->upkeep->update |= (PU_BONUS);
	}

	/* Decay special speed boost */
	if (player->speed_boost) {
		player->speed_boost = MAX(player->speed_boost - 10, 0);
		player->upkeep->update |= (PU_BONUS);
	}

	/* Process light */
	player_update_light(player);

	/* Update noise and scent (not if resting) */
	if (!player_is_resting(player)) {
		make_noise(cave, player, NULL);
		update_scent(cave, player, NULL);
	}

	/*** Process Inventory ***/

	/* Handle experience draining */
	if (player_of_has(player, OF_DRAIN_EXP)) {
		if ((player->exp > 0) && one_in_(10)) {
			int32_t d = damroll(10, 6) +
				(player->exp / 100) * z_info->life_drain_percent;
			player_exp_lose(player, d / 10, false);
		}

		equip_learn_flag(player, OF_DRAIN_EXP);
	}

	/* Recharge activatable objects and rods */
	recharge_objects();

	/* Notice things after time */
	if (!(turn % 100))
		equip_learn_after_time(player);

	/* Decrease trap timeouts */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct trap *trap = square(c, grid)->trap;
			bool changed = false;
			while (trap) {
				if (trap->timeout) {
					trap->timeout--;
					if (!trap->timeout) {
						changed = true;
					}
				}
				trap = trap->next;
			}
			if (changed && square_isseen(c, grid)) {
				square_memorize_traps(c, grid);
				square_light_spot(c, grid);
			}
		}
	}


	/*** Involuntary Movement ***/

	/* Delayed Word-of-Recall; suspended in arenas */
	if (player->word_recall && !player->upkeep->arena_level) {
		/* Count down towards recall */
		player->word_recall--;

		/* Activate the recall */
		if (!player->word_recall) {
			/*
			 * Disturbing!  Also, flush the command queue to avoid
			 * losing an action on the new level
			 */
			disturb(player);
			cmdq_flush();

			/* Determine the level */
			if (player->place != player->home) {
				int new_last_place = (player->upkeep->arena_level) ? player->last_place : 0;
				msgt(MSG_TPLEVEL, "You feel yourself yanked homewards!");
				player_change_place(player, player->home);
				player->last_place = new_last_place;
			} else {
				msgt(MSG_TPLEVEL, "You feel yourself yanked away!");
				player_change_place(player, player->recall_pt);
			}
		}
	}

	/* Delayed Deep Descent */
	if (player->deep_descent) {
		/* Count down towards descent */
		player->deep_descent--;

		/* Activate the descent */
		if (player->deep_descent == 0) {
			int increment;
			int target_place = player->max_depth;
			struct level *lev;

			/* Calculate target depth */
			//increment = (4 / z_info->stair_skip) + 1;
			increment = 5;
			target_place = player_get_next_place(player->place, "down",
												 increment);
			lev = &world->levels[target_place];

			disturb(player);

			/* Determine the level */
			if (lev->depth > player->depth) {
				msgt(MSG_TPLEVEL, "The floor opens beneath you!");
				player_change_place(player, target_place);
			} else {
				/* Otherwise do something disastrous */
				msgt(MSG_TPLEVEL, "You are thrown back in an explosion!");
				effect_simple(EF_DESTRUCTION, source_none(), "0", 0, 5, 0, 0, 0, NULL);
			}
		}
	}
}